

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

shared_ptr<QPDFObject> * __thiscall QPDF::resolve(QPDF *this,QPDFObjGen og)

{
  QPDF *og_00;
  bool bVar1;
  int iVar2;
  pointer pMVar3;
  size_type sVar4;
  size_type sVar5;
  mapped_type *this_00;
  string *description;
  QPDFExc *__return_storage_ptr__;
  QPDFObjGen this_01;
  element_type *this_02;
  shared_ptr<QPDFObject> *result;
  QPDFObjGen local_380;
  QPDF *local_378;
  QPDFExc *e;
  exception *e_1;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  QPDF *local_1a8;
  allocator<char> local_199;
  string local_198 [32];
  undefined1 local_178 [8];
  QPDFObjectHandle oh;
  QPDFObjGen a_og;
  qpdf_offset_t offset;
  QPDFXRefEntry *entry;
  ResolveRecorder rr;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  allocator<char> local_c9;
  string local_c8;
  QPDFExc local_a8;
  QPDFObjGen local_28;
  QPDF *local_20;
  QPDF *this_local;
  QPDFObjGen og_local;
  
  local_28 = og;
  local_20 = this;
  this_local = (QPDF *)og;
  bVar1 = isUnresolved(this,og);
  if (bVar1) {
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    sVar4 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::count
                      (&pMVar3->resolving,(key_type *)&this_local);
    if (sVar4 == 0) {
      ResolveRecorder::ResolveRecorder((ResolveRecorder *)&entry,this,(QPDFObjGen *)&this_local);
      pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      sVar5 = std::
              map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
              ::count(&pMVar3->xref_table,(QPDFObjGen *)&this_local);
      if (sVar5 != 0) {
        pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        this_00 = std::
                  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                  ::operator[](&pMVar3->xref_table,(key_type *)&this_local);
        iVar2 = QPDFXRefEntry::getType(this_00);
        if (iVar2 == 1) {
          description = (string *)QPDFXRefEntry::getOffset(this_00);
          QPDFObjGen::QPDFObjGen
                    ((QPDFObjGen *)
                     &oh.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_198,"",&local_199);
          local_1a8 = this_local;
          readObjectAtOffset((QPDF *)local_178,SUB81(this,0),1,description,(QPDFObjGen)local_198,
                             (QPDFObjGen *)this_local,(bool)((char)&oh + '\b'));
          std::__cxx11::string::~string(local_198);
          std::allocator<char>::~allocator(&local_199);
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_178);
        }
        else {
          if (iVar2 != 2) {
            e_1._7_1_ = 1;
            __return_storage_ptr__ = (QPDFExc *)__cxa_allocate_exception(0x80);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"",&local_1c9);
            QPDFObjGen::unparse_abi_cxx11_(&local_230,(QPDFObjGen *)&this_local,'/');
            std::operator+(&local_210,"object ",&local_230);
            std::operator+(&local_1f0,&local_210," has unexpected xref entry type");
            damagedPDF(__return_storage_ptr__,this,&local_1c8,-1,&local_1f0);
            e_1._7_1_ = 0;
            __cxa_throw(__return_storage_ptr__,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
          }
          iVar2 = QPDFXRefEntry::getObjStreamNumber(this_00);
          resolveObjectsInStream(this,iVar2);
        }
      }
      local_378 = this_local;
      bVar1 = isUnresolved(this,(QPDFObjGen)this_local);
      if (bVar1) {
        QTC::TC("qpdf","QPDF resolve failure to null",0);
        local_380 = (QPDFObjGen)this_local;
        QPDFObject::create<QPDF_Null>();
        updateCache(this,local_380,(shared_ptr<QPDFObject> *)&result,-1,-1,true);
        std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)&result);
      }
      pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      this_01 = (QPDFObjGen)
                std::
                map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
                ::operator[](&pMVar3->obj_cache,(key_type *)&this_local);
      this_02 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this_01);
      QPDFObject::setDefaultDescription(this_02,this,(QPDFObjGen *)&this_local);
      og_local = this_01;
      ResolveRecorder::~ResolveRecorder((ResolveRecorder *)&entry);
    }
    else {
      QTC::TC("qpdf","QPDF recursion loop in resolve",0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_c9);
      QPDFObjGen::unparse_abi_cxx11_(&local_120,(QPDFObjGen *)&this_local,' ');
      std::operator+(&local_100,"loop detected resolving object ",&local_120);
      damagedPDF(&local_a8,this,&local_c8,&local_100);
      warn(this,&local_a8);
      QPDFExc::~QPDFExc(&local_a8);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator(&local_c9);
      og_00 = this_local;
      QPDFObject::create<QPDF_Null>();
      updateCache(this,(QPDFObjGen)og_00,(shared_ptr<QPDFObject> *)&rr.iter,-1,-1,true);
      std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)&rr.iter);
      pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      og_local = (QPDFObjGen)
                 std::
                 map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
                 ::operator[](&pMVar3->obj_cache,(key_type *)&this_local);
    }
  }
  else {
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    og_local = (QPDFObjGen)
               std::
               map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
               ::operator[](&pMVar3->obj_cache,(key_type *)&this_local);
  }
  return (shared_ptr<QPDFObject> *)og_local;
}

Assistant:

std::shared_ptr<QPDFObject> const&
QPDF::resolve(QPDFObjGen og)
{
    if (!isUnresolved(og)) {
        return m->obj_cache[og].object;
    }

    if (m->resolving.count(og)) {
        // This can happen if an object references itself directly or indirectly in some key that
        // has to be resolved during object parsing, such as stream length.
        QTC::TC("qpdf", "QPDF recursion loop in resolve");
        warn(damagedPDF("", "loop detected resolving object " + og.unparse(' ')));
        updateCache(og, QPDFObject::create<QPDF_Null>(), -1, -1);
        return m->obj_cache[og].object;
    }
    ResolveRecorder rr(this, og);

    if (m->xref_table.count(og) != 0) {
        QPDFXRefEntry const& entry = m->xref_table[og];
        try {
            switch (entry.getType()) {
            case 1:
                {
                    qpdf_offset_t offset = entry.getOffset();
                    // Object stored in cache by readObjectAtOffset
                    QPDFObjGen a_og;
                    QPDFObjectHandle oh = readObjectAtOffset(true, offset, "", og, a_og, false);
                }
                break;

            case 2:
                resolveObjectsInStream(entry.getObjStreamNumber());
                break;

            default:
                throw damagedPDF(
                    "", -1, ("object " + og.unparse('/') + " has unexpected xref entry type"));
            }
        } catch (QPDFExc& e) {
            warn(e);
        } catch (std::exception& e) {
            warn(damagedPDF(
                "", -1, ("object " + og.unparse('/') + ": error reading object: " + e.what())));
        }
    }

    if (isUnresolved(og)) {
        // PDF spec says unknown objects resolve to the null object.
        QTC::TC("qpdf", "QPDF resolve failure to null");
        updateCache(og, QPDFObject::create<QPDF_Null>(), -1, -1);
    }

    auto& result(m->obj_cache[og].object);
    result->setDefaultDescription(this, og);
    return result;
}